

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall
ArmParser::decodeArmOpcode(ArmParser *this,string *name,tArmOpcode *opcode,ArmOpcodeVariables *vars)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  bool *dest;
  char *pcVar5;
  size_t pos;
  size_t local_48;
  bool *local_40;
  uchar *local_38;
  
  (vars->Opcode).c = '\0';
  (vars->Opcode).a = '\0';
  (vars->Opcode).s = false;
  pcVar5 = opcode->name;
  local_48 = 0;
  local_38 = &(vars->Opcode).a;
  local_40 = &(vars->Opcode).s;
  do {
    while( true ) {
      cVar2 = *pcVar5;
      if (cVar2 == '\0') {
        return name->_M_string_length <= local_48;
      }
      pcVar5 = pcVar5 + 1;
      if (cVar2 != 'A') break;
      bVar3 = decodeAddressingMode(this,name,&local_48,local_38);
LAB_00154273:
      if (bVar3 == false) {
        return false;
      }
    }
    dest = &(vars->Opcode).y;
    if (cVar2 == 'Y') {
LAB_0015422e:
      bVar3 = decodeXY(this,name,&local_48,dest);
      goto LAB_00154273;
    }
    if (cVar2 == 'S') {
      decodeS(this,name,&local_48,local_40);
    }
    else {
      dest = &(vars->Opcode).x;
      if (cVar2 == 'X') goto LAB_0015422e;
      if (cVar2 == 'C') {
        iVar4 = decodeCondition(this,name,&local_48);
        (vars->Opcode).c = (uchar)iVar4;
      }
      else {
        if (name->_M_string_length <= local_48) {
          return false;
        }
        pcVar1 = (name->_M_dataplus)._M_p + local_48;
        local_48 = local_48 + 1;
        if (cVar2 != *pcVar1) {
          return false;
        }
      }
    }
  } while( true );
}

Assistant:

bool ArmParser::decodeArmOpcode(const std::string& name, const tArmOpcode& opcode, ArmOpcodeVariables& vars)
{
	vars.Opcode.c = vars.Opcode.a = 0;
	vars.Opcode.s = false;

	const char* encoding = opcode.name;
	size_t pos = 0;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'C':	// condition
			vars.Opcode.c = decodeCondition(name,pos);
			break;
		case 'S':	// set flag
			decodeS(name,pos,vars.Opcode.s);
			break;
		case 'A':	// addressing mode
			CHECK(decodeAddressingMode(name,pos,vars.Opcode.a));
			break;
		case 'X':	// x flag
			CHECK(decodeXY(name,pos,vars.Opcode.x));
			break;
		case 'Y':	// y flag
			CHECK(decodeXY(name,pos,vars.Opcode.y));
			break;
		default:
			CHECK(pos < name.size());
			CHECK(*(encoding-1) == name[pos++]);
			break;
		}
	}

	return pos >= name.size();
}